

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.cpp
# Opt level: O3

int __thiscall ncnn::CELU::forward_inplace(CELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    pvVar6 = bottom_top_blob->data;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          fVar9 = *(float *)((long)pvVar6 + uVar7 * 4);
          if (fVar9 < 0.0) {
            fVar1 = this->alpha;
            fVar9 = expf(fVar9 / fVar1);
            *(float *)((long)pvVar6 + uVar7 * 4) = (fVar9 + -1.0) * fVar1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      lVar5 = lVar5 + 1;
      pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
    } while (lVar5 != iVar2);
  }
  return 0;
}

Assistant:

int CELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (expf(ptr[i] / alpha) - 1.f) * alpha;
        }
    }

    return 0;
}